

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double r8_gamma_inc(double p,double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double xbig;
  double tol;
  double value;
  double rn;
  double pn6;
  double pn5;
  double pn4;
  double pn3;
  double pn2;
  double pn1;
  double plimit;
  double overflow;
  double exp_arg_min;
  double c;
  double b;
  double arg;
  double a;
  double x_local;
  double p_local;
  
  if (p <= 0.0) {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"R8_GAMMA_INC - Fatal error!\n");
    std::operator<<((ostream *)&std::cerr,"  Parameter P <= 0.\n");
    exit(1);
  }
  if (0.0 < x) {
    if (p <= 1000.0) {
      if (x <= 100000000.0) {
        if ((1.0 < x) && (p <= x)) {
          dVar3 = log(x);
          dVar4 = lgamma(p);
          arg = 1.0 - p;
          c = arg + x + 1.0;
          exp_arg_min = 0.0;
          pn2 = 1.0;
          tol = (x + 1.0) / (x * c);
          dVar1 = x * c;
          dVar2 = x + 1.0;
          pn3 = x;
          do {
            pn4 = dVar2;
            pn5 = dVar1;
            arg = arg + 1.0;
            c = c + 2.0;
            exp_arg_min = exp_arg_min + 1.0;
            dVar2 = c * pn4 + -(arg * exp_arg_min * pn2);
            dVar1 = c * pn5 + -(arg * exp_arg_min * pn3);
            dVar5 = tol;
            if (0.0 < ABS(dVar1)) {
              dVar5 = dVar2 / dVar1;
              dVar6 = r8_min(1e-07,dVar5 * 1e-07);
              if (ABS(tol - dVar5) <= dVar6) {
                dVar1 = log(tol);
                dVar1 = ((p * dVar3 + -x) - dVar4) + dVar1;
                if (dVar1 < -88.0) {
                  tol = 1.0;
                }
                else {
                  dVar1 = exp(dVar1);
                  tol = 1.0 - dVar1;
                }
                return tol;
              }
            }
            tol = dVar5;
            pn2 = pn4;
            pn3 = pn5;
            if (1e+37 <= ABS(dVar2)) {
              pn2 = pn4 / 1e+37;
              pn3 = pn5 / 1e+37;
              dVar1 = dVar1 / 1e+37;
              dVar2 = dVar2 / 1e+37;
            }
          } while( true );
        }
        dVar1 = log(x);
        dVar2 = lgamma(p + 1.0);
        exp_arg_min = 1.0;
        tol = 1.0;
        arg = p;
        do {
          arg = arg + 1.0;
          exp_arg_min = (exp_arg_min * x) / arg;
          tol = tol + exp_arg_min;
        } while (1e-07 < exp_arg_min);
        dVar3 = log(tol);
        dVar3 = ((p * dVar1 + -x) - dVar2) + dVar3;
        if (dVar3 < -88.0) {
          tol = 0.0;
        }
        else {
          tol = exp(dVar3);
        }
        p_local = tol;
      }
      else {
        p_local = 1.0;
      }
    }
    else {
      dVar1 = sqrt(p);
      dVar2 = pow(x / p,0.3333333333333333);
      p_local = normal_01_cdf(dVar1 * 3.0 * ((dVar2 + 1.0 / (p * 9.0)) - 1.0));
    }
  }
  else {
    p_local = 0.0;
  }
  return p_local;
}

Assistant:

double r8_gamma_inc ( double p, double x )

//****************************************************************************80
//
//  Purpose:
//
//    R8_GAMMA_INC computes the incomplete Gamma function.
//
//  Discussion:
//
//    GAMMA_INC(P,       0) = 0,
//    GAMMA_INC(P,Infinity) = 1.
//
//    GAMMA_INC(P,X) = Integral ( 0 <= T <= X ) T^(P-1) EXP(-T) DT / GAMMA(P).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    Original FORTRAN77 version by B L Shea.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    B L Shea,
//    Chi-squared and Incomplete Gamma Integral,
//    Algorithm AS239,
//    Applied Statistics,
//    Volume 37, Number 3, 1988, pages 466-473.
//
//  Parameters:
//
//    Input, double P, the exponent parameter.
//    0.0 < P.
//
//    Input, double X, the integral limit parameter.
//    If X is less than or equal to 0, the value is returned as 0.
//
//    Output, double R8_GAMMA_INC, the value of the function.
//
{
  double a;
  double arg;
  double b;
  double c;
  double exp_arg_min = -88.0;
  double overflow = 1.0E+37;
  double plimit = 1000.0;
  double pn1;
  double pn2;
  double pn3;
  double pn4;
  double pn5;
  double pn6;
  double rn;
  double value;
  double tol = 1.0E-07;
  double xbig = 1.0E+08;

  value = 0.0;

  if ( p <= 0.0 )
  {
    cerr << " \n";
    cerr << "R8_GAMMA_INC - Fatal error!\n";
    cerr << "  Parameter P <= 0.\n";
    exit ( 1 );
  }

  if ( x <= 0.0 )
  {
    value = 0.0;
    return value;
  }
//
//  Use a normal approximation if PLIMIT < P.
//
  if ( plimit < p )
  {
    pn1 = 3.0 * sqrt ( p ) * ( pow ( x / p, 1.0 / 3.0 )
      + 1.0 / ( 9.0 * p ) - 1.0 );
    value = normal_01_cdf ( pn1 );
    return value;
  }
//
//  Is X extremely large compared to P?
//
  if ( xbig < x )
  {
    value = 1.0;
    return value;
  }
//
//  Use Pearson's series expansion.
//  (P is not large enough to force overflow in the log of Gamma.
//
  if ( x <= 1.0 || x < p )
  {
    arg = p * log ( x ) - x - lgamma ( p + 1.0 );
    c = 1.0;
    value = 1.0;
    a = p;

    for ( ; ; )
    {
      a = a + 1.0;
      c = c * x / a;
      value = value + c;

      if ( c <= tol )
      {
        break;
      }
    }

    arg = arg + log ( value );

    if ( exp_arg_min <= arg )
    {
      value = exp ( arg );
    }
    else
    {
      value = 0.0;
    }
  }
//
//  Use a continued fraction expansion.
//
  else
  {
    arg = p * log ( x ) - x - lgamma ( p );
    a = 1.0 - p;
    b = a + x + 1.0;
    c = 0.0;
    pn1 = 1.0;
    pn2 = x;
    pn3 = x + 1.0;
    pn4 = x * b;
    value = pn3 / pn4;

    for ( ; ; )
    {
      a = a + 1.0;
      b = b + 2.0;
      c = c + 1.0;
      pn5 = b * pn3 - a * c * pn1;
      pn6 = b * pn4 - a * c * pn2;

      if ( 0.0 < fabs ( pn6 ) )
      {
        rn = pn5 / pn6;

        if ( fabs ( value - rn ) <= r8_min ( tol, tol * rn ) )
        {
          arg = arg + log ( value );

          if ( exp_arg_min <= arg )
          {
            value = 1.0 - exp ( arg );
          }
          else
          {
            value = 1.0;
          }

          return value;
        }
        value = rn;
      }
      pn1 = pn3;
      pn2 = pn4;
      pn3 = pn5;
      pn4 = pn6;
//
//  Rescale terms in continued fraction if terms are large.
//
      if ( overflow <= fabs ( pn5 ) )
      {
        pn1 = pn1 / overflow;
        pn2 = pn2 / overflow;
        pn3 = pn3 / overflow;
        pn4 = pn4 / overflow;
      }
    }
  }

  return value;
}